

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glib_compat.c
# Opt level: O1

void g_list_free(GList *list)

{
  GList *pGVar1;
  GList *__ptr;
  
  if (list == (GList *)0x0) {
    __ptr = (GList *)0x0;
  }
  else {
    __ptr = list->prev;
    do {
      pGVar1 = list->next;
      free(list);
      list = pGVar1;
    } while (pGVar1 != (GList *)0x0);
  }
  while (__ptr != (GList *)0x0) {
    pGVar1 = __ptr->prev;
    free(__ptr);
    __ptr = pGVar1;
  }
  return;
}

Assistant:

void g_list_free(GList *list)
{
    GList *lp, *next, *prev = NULL;
    if (list) prev = list->prev;
    for (lp = list; lp; lp = next) {
        next = lp->next;
        free(lp);
    }
    for (lp = prev; lp; lp = prev) {
        prev = lp->prev;
        free(lp);
    }
}